

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::getShaderImageFormatQualifier_abi_cxx11_
          (string *__return_storage_ptr__,Functional *this,TextureFormat *format)

{
  char *__rhs;
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pcVar1 = (char *)0x0;
  if (*(int *)this == 8) {
    pcVar1 = "rgba";
  }
  __rhs = "r";
  if (*(int *)this != 0) {
    __rhs = pcVar1;
  }
  switch(*(undefined4 *)(this + 4)) {
  case 0x1b:
    pcVar1 = "8i";
    break;
  case 0x1c:
    pcVar1 = "16i";
    break;
  case 0x1d:
    pcVar1 = "32i";
    break;
  case 0x1e:
    pcVar1 = "8ui";
    break;
  case 0x1f:
    pcVar1 = "16ui";
    break;
  case 0x20:
switchD_0124a4e6_caseD_20:
    pcVar1 = (char *)0x0;
    break;
  case 0x21:
    pcVar1 = "32ui";
    break;
  case 0x22:
    pcVar1 = "16f";
    break;
  case 0x23:
    pcVar1 = "32f";
    break;
  default:
    switch(*(undefined4 *)(this + 4)) {
    case 0:
      pcVar1 = "8_snorm";
      break;
    case 1:
      pcVar1 = "16_snorm";
      break;
    default:
      goto switchD_0124a4e6_caseD_20;
    case 3:
      pcVar1 = "8";
      break;
    case 4:
      pcVar1 = "16";
    }
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_30,&local_50,__rhs);
  std::operator+(__return_storage_ptr__,&local_30,pcVar1);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

static inline string getShaderImageFormatQualifier (const TextureFormat& format)
{
	const char* orderPart;
	const char* typePart;

	switch (format.order)
	{
		case TextureFormat::R:		orderPart = "r";		break;
		case TextureFormat::RGBA:	orderPart = "rgba";		break;
		default:
			DE_ASSERT(false);
			orderPart = DE_NULL;
	}

	switch (format.type)
	{
		case TextureFormat::FLOAT:				typePart = "32f";			break;
		case TextureFormat::HALF_FLOAT:			typePart = "16f";			break;

		case TextureFormat::UNSIGNED_INT32:		typePart = "32ui";			break;
		case TextureFormat::UNSIGNED_INT16:		typePart = "16ui";			break;
		case TextureFormat::UNSIGNED_INT8:		typePart = "8ui";			break;

		case TextureFormat::SIGNED_INT32:		typePart = "32i";			break;
		case TextureFormat::SIGNED_INT16:		typePart = "16i";			break;
		case TextureFormat::SIGNED_INT8:		typePart = "8i";			break;

		case TextureFormat::UNORM_INT16:		typePart = "16";			break;
		case TextureFormat::UNORM_INT8:			typePart = "8";				break;

		case TextureFormat::SNORM_INT16:		typePart = "16_snorm";		break;
		case TextureFormat::SNORM_INT8:			typePart = "8_snorm";		break;

		default:
			DE_ASSERT(false);
			typePart = DE_NULL;
	}

	return string() + orderPart + typePart;
}